

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

int testing::internal::GetRandomSeedFromFlag(Int32 random_seed_flag)

{
  TimeInMillis TVar1;
  
  if (random_seed_flag == 0) {
    TVar1 = GetTimeInMillis();
    random_seed_flag = (Int32)TVar1;
  }
  return (random_seed_flag - 1U) % 99999 + 1;
}

Assistant:

inline int GetRandomSeedFromFlag(Int32 random_seed_flag) {
  const unsigned int raw_seed = (random_seed_flag == 0) ?
      static_cast<unsigned int>(GetTimeInMillis()) :
      static_cast<unsigned int>(random_seed_flag);

  // Normalizes the actual seed to range [1, kMaxRandomSeed] such that
  // it's easy to type.
  const int normalized_seed =
      static_cast<int>((raw_seed - 1U) %
                       static_cast<unsigned int>(kMaxRandomSeed)) + 1;
  return normalized_seed;
}